

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Circle.cc
# Opt level: O0

void anon_unknown.dwarf_cdd::setupScenario
               (RVOSimulator *simulator,vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *goals)

{
  RVOSimulator *pRVar1;
  Vector2 *this;
  RVOSimulator *in_RDI;
  float fVar2;
  double dVar3;
  size_t i;
  undefined4 in_stack_ffffffffffffffa8;
  float fVar4;
  float fVar5;
  float local_44;
  float local_34;
  Vector2 local_28 [8];
  undefined8 local_20;
  ulong local_18;
  RVOSimulator *local_8;
  
  local_8 = in_RDI;
  RVO::RVOSimulator::setTimeStep(in_RDI,0.25);
  RVO::RVOSimulator::setAgentDefaults(15.0,(ulong)local_8,10.0,10.0,1.5,2.0);
  for (local_18 = 0; pRVar1 = local_8, local_18 < 0xfa; local_18 = local_18 + 1) {
    local_34 = (float)local_18;
    fVar4 = 6.2831855;
    fVar5 = 0.004;
    dVar3 = std::cos((double)(ulong)(uint)(local_34 * 6.2831855 * 0.004));
    fVar2 = SUB84(dVar3,0);
    local_44 = (float)local_18;
    dVar3 = std::sin((double)(ulong)(uint)(local_44 * fVar4 * fVar5));
    RVO::Vector2::Vector2(local_28,fVar2,SUB84(dVar3,0));
    local_20 = RVO::operator*(200.0,local_28);
    RVO::RVOSimulator::addAgent((Vector2 *)pRVar1);
    this = (Vector2 *)RVO::RVOSimulator::getAgentPosition((ulong)local_8);
    RVO::Vector2::operator-(this);
    std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::push_back
              ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)CONCAT44(fVar2,fVar5),
               (value_type *)CONCAT44(fVar4,in_stack_ffffffffffffffa8));
  }
  return;
}

Assistant:

void setupScenario(
    RVO::RVOSimulator *simulator,
    std::vector<RVO::Vector2> &goals) { /* NOLINT(runtime/references) */
  /* Specify the global time step of the simulation. */
  simulator->setTimeStep(0.25F);

  /* Specify the default parameters for agents that are subsequently added. */
  simulator->setAgentDefaults(15.0F, 10U, 10.0F, 10.0F, 1.5F, 2.0F);

  /* Add agents, specifying their start position, and store their goals on the
   * opposite side of the environment. */
  for (std::size_t i = 0U; i < 250U; ++i) {
    simulator->addAgent(
        200.0F *
        RVO::Vector2(std::cos(static_cast<float>(i) * RVO_TWO_PI * 0.004F),
                     std::sin(static_cast<float>(i) * RVO_TWO_PI * 0.004F)));
    goals.push_back(-simulator->getAgentPosition(i));
  }
}